

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
ShowRulesIRCCommand::trigger
          (ShowRulesIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  undefined8 uVar4;
  char *pcVar5;
  uint uVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  string msg;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  pcVar5 = channel._M_str;
  lVar2 = Jupiter::IRC::Client::getChannel
                    (source,channel._M_len,pcVar5,pcVar5,nick._M_len,nick._M_str);
  if (lVar2 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    msg._M_string_length = 0;
    msg.field_2._M_local_buf[0] = '\0';
    uVar6 = 0;
    while( true ) {
      RenX::getCore();
      uVar3 = RenX::Core::getServerCount();
      if (uVar3 == uVar6) break;
      uVar3 = RenX::getCore();
      uVar4 = RenX::Core::getServer(uVar3);
      cVar1 = RenX::Server::isLogChanType((int)uVar4);
      if (cVar1 != '\0') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&msg,"Rules: ");
        bVar7 = (basic_string_view<char,_std::char_traits<char>_>)RenX::Server::getRules();
        local_40 = bVar7;
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)&msg,&local_40);
        RenX::Server::sendMessage(uVar4,msg._M_string_length,msg._M_dataplus._M_p);
      }
      uVar6 = uVar6 + 1;
    }
    if (msg._M_string_length == 0) {
      Jupiter::IRC::Client::sendMessage
                (source,channel._M_len,pcVar5,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void ShowRulesIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		std::string msg;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				msg = "Rules: ";
				msg += server->getRules();
				server->sendMessage(msg);
			}
		}
		if (msg.empty())
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}